

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::hidePopup(QComboBox *this)

{
  QComboBoxPrivate *this_00;
  Data *pDVar1;
  char cVar2;
  int iVar3;
  QItemSelectionModel *pQVar4;
  QStyle *pQVar5;
  undefined4 *puVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_68;
  QItemSelectionModel *local_50;
  QArrayDataPointer<QItemSelectionRange> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x34c & 0x10) != 0) goto LAB_003e267b;
  this_00->field_0x34c = this_00->field_0x34c | 0x10;
  pDVar1 = (this_00->container).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      ((this_00->container).wp.value != (QObject *)0x0)) &&
     ((*(byte *)(*(long *)((this_00->container).wp.value + 0x20) + 9) & 0x80) != 0)) {
    if (*(long *)((this_00->container).wp.value + 0x50) == 0) {
      pQVar4 = (QItemSelectionModel *)0x0;
    }
    else {
      pQVar4 = QAbstractItemView::selectionModel
                         (*(QAbstractItemView **)((this_00->container).wp.value + 0x50));
    }
    pQVar5 = QWidget::style(&this->super_QWidget);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x51,0,this,0);
    if ((pQVar4 != (QItemSelectionModel *)0x0) && (iVar3 != 0)) {
      cVar2 = QItemSelectionModel::hasSelection();
      if (cVar2 != '\0') {
        local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
        QItemSelectionModel::selection();
        pDVar1 = (this_00->container).wp.d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar7 = (QObject *)0x0;
        }
        else {
          pQVar7 = (this_00->container).wp.value;
        }
        local_68.d = local_48.d;
        local_68.ptr = local_48.ptr;
        local_68.size = local_48.size;
        if (local_48.d != (Data *)0x0) {
          LOCK();
          ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_50 = pQVar4;
        puVar6 = (undefined4 *)operator_new(0x38);
        *puVar6 = 1;
        *(code **)(puVar6 + 2) =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qcombobox.cpp:2921:45),_QtPrivate::List<>,_void>
             ::impl;
        *(QComboBoxPrivate **)(puVar6 + 4) = this_00;
        *(Data **)(puVar6 + 6) = local_68.d;
        *(QItemSelectionRange **)(puVar6 + 8) = local_68.ptr;
        *(qsizetype *)(puVar6 + 10) = local_68.size;
        if (local_68.d != (Data *)0x0) {
          LOCK();
          ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        *(QItemSelectionModel **)(puVar6 + 0xc) = local_50;
        QTimer::singleShotImpl(0,0,pQVar7,puVar6);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_48);
        goto LAB_003e2674;
      }
    }
    QComboBoxPrivate::doHidePopup(this_00);
  }
LAB_003e2674:
  this_00->field_0x34c = this_00->field_0x34c & 0xef;
LAB_003e267b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::hidePopup()
{
    Q_D(QComboBox);
    if (d->hidingPopup)
        return;
    d->hidingPopup = true;
    // can't use QScopedValueRollback on a bitfield
    auto resetHidingPopup = qScopeGuard([d]{
        d->hidingPopup = false;
    });

    if (!d->container || !d->container->isVisible())
        return;

#if QT_CONFIG(effects)
    QItemSelectionModel *selectionModel = d->container->itemView()
                                        ? d->container->itemView()->selectionModel() : nullptr;
    // Flash selected/triggered item (if any) before hiding the popup.
    if (style()->styleHint(QStyle::SH_Menu_FlashTriggeredItem, nullptr, this) &&
        selectionModel && selectionModel->hasSelection()) {
        const QItemSelection selection = selectionModel->selection();

        QTimer::singleShot(0, d->container, [d, selection, selectionModel]{
            QSignalBlocker modelBlocker(d->model);
            QSignalBlocker viewBlocker(d->container->itemView());
            QSignalBlocker containerBlocker(d->container);

            // Deselect item and wait 60 ms.
            selectionModel->select(selection, QItemSelectionModel::Toggle);
            QTimer::singleShot(60, d->container, [d, selection, selectionModel]{
                QSignalBlocker modelBlocker(d->model);
                QSignalBlocker viewBlocker(d->container->itemView());
                QSignalBlocker containerBlocker(d->container);
                selectionModel->select(selection, QItemSelectionModel::Toggle);
                QTimer::singleShot(20, d->container, [d] {
                    d->doHidePopup();
                });
            });
        });
    } else
#endif // QT_CONFIG(effects)
    {
        d->doHidePopup();
    }
}